

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix-test.cc
# Opt level: O1

void __thiscall
SuffixTest_DoubleSuffix_Test::~SuffixTest_DoubleSuffix_Test(SuffixTest_DoubleSuffix_Test *this)

{
  (this->super_SuffixTest).super_Test._vptr_Test = (_func_int **)&PTR__SuffixTest_00172b40;
  mp::BasicSuffixSet<std::allocator<char>_>::~BasicSuffixSet(&(this->super_SuffixTest).suffixes_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x48);
  return;
}

Assistant:

TEST_F(SuffixTest, DoubleSuffix) {
  mp::DoubleSuffix s;
  EXPECT_TRUE(s == 0);
  s = suffixes_.Add<double>("test", 11, 222);
  EXPECT_STREQ("test", s.name());
  EXPECT_EQ(11 | suf::FLOAT, s.kind());
  EXPECT_EQ(222, s.num_values());
  EXPECT_TRUE(IsDouble<mp::DoubleSuffix::Type>::VALUE);
}